

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::checkValidUnitString(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  string *unit;
  string *psVar4;
  size_type sVar5;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char current;
  size_t index;
  value_type *seq;
  const_iterator __end2;
  const_iterator __begin2;
  array<const_char_*,_2UL> *__range2;
  bool skipcodereplacement;
  size_type cx2;
  size_type cx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  string *index_00;
  string *unit_string_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  size_type local_20;
  
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if ((*pvVar2 == '^') ||
     (pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)), *pvVar2 == '^'
     )) {
    return false;
  }
  local_20 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  while (local_20 != 0xffffffffffffffff) {
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    sVar5 = local_20 + 1;
    local_20 = sVar3;
    if (sVar3 == sVar5) {
      return false;
    }
  }
  if ((in_RSI & 0x1000000000) != 0) {
    return true;
  }
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::array<const_char_*,_2UL>::begin((array<const_char_*,_2UL> *)0x733025);
  unit = (string *)std::array<const_char_*,_2UL>::end((array<const_char_*,_2UL> *)0x733036);
  for (; local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit;
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_40->_M_string_length) {
    in_stack_ffffffffffffffb0 = local_40;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (local_40,in_stack_ffffffffffffffa8,
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (sVar3 != 0xffffffffffffffff) {
      return false;
    }
  }
  index_00 = (string *)0x0;
LAB_00733092:
  do {
    unit_string_00 = index_00;
    psVar4 = (string *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(in_RDI);
    if (psVar4 <= index_00) {
      bVar1 = checkExponentOperations(unit_string_00);
      if (bVar1) {
        return true;
      }
      return false;
    }
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (size_type)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff94 = (int)*pvVar2;
    if ((in_stack_ffffffffffffff94 != 0x22) && (in_stack_ffffffffffffff94 != 0x28)) {
      if (in_stack_ffffffffffffff94 == 0x29) {
        return false;
      }
      if (in_stack_ffffffffffffff94 != 0x5b) {
        if (in_stack_ffffffffffffff94 == 0x5d) {
          return false;
        }
        if (in_stack_ffffffffffffff94 != 0x7b) {
          if (in_stack_ffffffffffffff94 == 0x7d) {
            return false;
          }
          index_00 = (string *)((long)&(unit_string_00->_M_dataplus)._M_p + 1);
          goto LAB_00733092;
        }
      }
    }
    index_00 = (string *)((long)&(unit_string_00->_M_dataplus)._M_p + 1);
    in_stack_ffffffffffffff88 = in_RDI;
    getMatchCharacter(*pvVar2);
    bVar1 = segmentcheck(unit,(char)((ulong)in_stack_ffffffffffffffb0 >> 0x38),(size_t *)index_00);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

static bool checkValidUnitString(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    static constexpr std::array<const char*, 2> invalidSequences{{"-+", "+-"}};
    if (unit_string.front() == '^' || unit_string.back() == '^') {
        return false;
    }
    auto cx = unit_string.find_first_of("*/^");
    while (cx != std::string::npos) {
        auto cx2 = unit_string.find_first_of("*/^", cx + 1);
        if (cx2 == cx + 1) {
            return false;
        }
        cx = cx2;
    }
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    if (!skipcodereplacement) {
        for (const auto& seq : invalidSequences) {
            if (unit_string.find(seq) != std::string::npos) {
                return false;
            }
        }

        size_t index = 0;
        while (index < unit_string.size()) {
            char current = unit_string[index];
            switch (current) {
                case '{':
                case '(':
                case '[':
                case '"':
                    ++index;
                    if (!segmentcheck(
                            unit_string, getMatchCharacter(current), index)) {
                        return false;
                    }
                    break;
                case '}':
                case ')':
                case ']':
                    return false;

                default:
                    ++index;
                    break;
            }
        }
        if (!checkExponentOperations(unit_string)) {
            return false;
        }
    }

    return true;
}